

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::Utils::GetDefinitions_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,PtrVector *vector,FLAVOUR flavour)

{
  uint uVar1;
  size_t position;
  size_t local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"LIST",(allocator<char> *)&local_50);
  local_58 = 0;
  uVar1 = 0;
  while( true ) {
    if ((ulong)(*(long *)(this + 8) - *(long *)this >> 3) <= (ulong)uVar1) break;
    Variable::GetDefinition_abi_cxx11_
              (&local_50,*(Variable **)(*(long *)this + (ulong)uVar1 * 8),(FLAVOUR)vector);
    insertElementOfList(local_50._M_dataplus._M_p,"\n",&local_58,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    uVar1 = uVar1 + 1;
  }
  endList(glcts::fixed_sample_locations_values + 1,&local_58,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetDefinitions(const Variable::PtrVector& vector, Variable::FLAVOUR flavour)
{
	std::string list	 = Utils::g_list;
	size_t		position = 0;

	for (GLuint i = 0; i < vector.size(); ++i)
	{
		Utils::insertElementOfList(vector[i]->GetDefinition(flavour).c_str(), "\n", position, list);
	}

	Utils::endList("", position, list);

	return list;
}